

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  ImGuiKey IVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ImGuiKeyChord IVar5;
  ImGuiKeyData *pIVar6;
  byte bVar7;
  byte in_DIL;
  int n_1;
  int n;
  bool focus_lost;
  uint c;
  int key_data_index;
  ImGuiKeyData *key_data;
  ImGuiKey key;
  ImGuiMouseButton button;
  ImVec2 event_pos;
  ImGuiInputEvent *e;
  int event_n;
  ImBitArray<652,_0> key_changed_mask;
  int mouse_button_changed;
  bool text_inputted;
  bool key_changed;
  bool mouse_wheeled;
  bool mouse_moved;
  bool trickle_interleaved_keys_and_text;
  ImGuiIO *io;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  ImGuiInputEvent *e_00;
  ImGuiIO *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  ImGuiKey in_stack_ffffffffffffff3c;
  ImVector<ImGuiInputEvent> *in_stack_ffffffffffffff40;
  bool local_b5;
  int local_b4;
  int local_b0;
  ImVec2 local_90;
  ImGuiInputEvent *local_88;
  int local_7c;
  uint local_24;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  bool local_19;
  ImGuiIO *local_18;
  ImGuiContext *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_10 = GImGui;
  local_18 = &GImGui->IO;
  local_b5 = false;
  if (local_1 != 0) {
    local_b5 = GImGui->WantTextInputNextFrame == 1;
  }
  local_19 = local_b5;
  local_1a = 0;
  local_1b = 0;
  local_1c = 0;
  local_1d = 0;
  local_24 = 0;
  ImBitArray<652,_0>::ImBitArray((ImBitArray<652,_0> *)0x4a427e);
  for (local_7c = 0; local_7c < (local_10->InputEventsQueue).Size; local_7c = local_7c + 1) {
    local_88 = ImVector<ImGuiInputEvent>::operator[](&local_10->InputEventsQueue,local_7c);
    if (local_88->Type == ImGuiInputEventType_MousePos) {
      ImVec2::ImVec2(&local_90,(local_88->field_2).MousePos.PosX,(local_88->field_2).MousePos.PosY);
      if (((local_1 & 1) != 0) &&
         ((((local_24 != 0 || ((local_1b & 1) != 0)) || ((local_1c & 1) != 0)) ||
          ((local_1d & 1) != 0)))) break;
      local_18->MousePos = local_90;
      local_1a = 1;
    }
    else if (local_88->Type == ImGuiInputEventType_MouseButton) {
      IVar1 = (local_88->field_2).Key.Key;
      bVar7 = (byte)IVar1;
      if (((local_1 & 1) != 0) && (((local_24 & 1 << (bVar7 & 0x1f)) != 0 || ((local_1b & 1) != 0)))
         ) break;
      local_18->MouseDown[(int)IVar1] = (bool)((local_88->field_2).MouseButton.Down & 1);
      local_24 = 1 << (bVar7 & 0x1f) | local_24;
    }
    else if (local_88->Type == ImGuiInputEventType_MouseWheel) {
      if (((local_1 & 1) != 0) && (((local_1a & 1) != 0 || (local_24 != 0)))) break;
      local_18->MouseWheelH = (local_88->field_2).MousePos.PosX + local_18->MouseWheelH;
      local_18->MouseWheel = (local_88->field_2).MousePos.PosY + local_18->MouseWheel;
      local_1b = 1;
    }
    else if (local_88->Type == ImGuiInputEventType_Key) {
      iVar2 = (local_88->field_2).MouseButton.Button;
      pIVar6 = GetKeyData((ImGuiKey)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      iVar4 = (int)((long)pIVar6 - (long)(local_10->IO).KeysData >> 4);
      if ((((local_1 & 1) != 0) &&
          ((pIVar6->Down & 1U) != ((local_88->field_2).MouseButton.Down & 1U))) &&
         ((bVar3 = ImBitArray<652,_0>::TestBit
                             ((ImBitArray<652,_0> *)in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff1c), bVar3 ||
          (((local_1d & 1) != 0 || (local_24 != 0)))))) break;
      pIVar6->Down = (bool)((local_88->field_2).MouseButton.Down & 1);
      pIVar6->AnalogValue = (local_88->field_2).Key.AnalogValue;
      local_1c = 1;
      ImBitArray<652,_0>::SetBit
                ((ImBitArray<652,_0> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      if ((iVar2 == 0x1000) || (((iVar2 == 0x2000 || (iVar2 == 0x4000)) || (iVar2 == 0x8000)))) {
        if (iVar2 == 0x1000) {
          local_18->KeyCtrl = (bool)(pIVar6->Down & 1);
        }
        if (iVar2 == 0x2000) {
          local_18->KeyShift = (bool)(pIVar6->Down & 1);
        }
        if (iVar2 == 0x4000) {
          local_18->KeyAlt = (bool)(pIVar6->Down & 1);
        }
        if (iVar2 == 0x8000) {
          local_18->KeySuper = (bool)(pIVar6->Down & 1);
        }
        IVar5 = GetMergedModsFromBools();
        local_18->KeyMods = IVar5;
      }
      local_18->KeysDown[iVar4] = (bool)(pIVar6->Down & 1);
      if (local_18->KeyMap[iVar4] != -1) {
        local_18->KeysDown[local_18->KeyMap[iVar4]] = (bool)(pIVar6->Down & 1);
      }
    }
    else if (local_88->Type == ImGuiInputEventType_Text) {
      if (((local_1 & 1) != 0) &&
         (((((local_1c & 1) != 0 && ((local_19 & 1U) != 0)) || (local_24 != 0)) ||
          (((local_1a & 1) != 0 || ((local_1b & 1) != 0)))))) break;
      in_stack_ffffffffffffff3c = (local_88->field_2).Key.Key;
      in_stack_ffffffffffffff40 = (ImVector<ImGuiInputEvent> *)&local_18->InputQueueCharacters;
      if (in_stack_ffffffffffffff3c < 0x10000) {
        in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c & 0xffff;
      }
      else {
        in_stack_ffffffffffffff3c = 0xfffd;
      }
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)in_stack_ffffffffffffff20,
                 (unsigned_short *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if ((local_19 & 1U) != 0) {
        local_1d = 1;
      }
    }
    else if (local_88->Type == ImGuiInputEventType_Focus) {
      local_18->AppFocusLost = (bool)(((local_88->field_2).AppFocused.Focused ^ 0xffU) & 1);
    }
  }
  for (local_b0 = 0; local_b0 < local_7c; local_b0 = local_b0 + 1) {
    in_stack_ffffffffffffff30 = (ImGuiIO *)&local_10->InputEventsTrail;
    ImVector<ImGuiInputEvent>::operator[](&local_10->InputEventsQueue,local_b0);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)in_stack_ffffffffffffff20,
               (ImGuiInputEvent *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if ((local_7c != 0) && ((local_10->DebugLogFlags & 0x20U) != 0)) {
    for (local_b4 = 0; local_b4 < (local_10->InputEventsQueue).Size; local_b4 = local_b4 + 1) {
      if (local_b4 < local_7c) {
        in_stack_ffffffffffffff20 = "Processed";
      }
      else {
        in_stack_ffffffffffffff20 = "Remaining";
      }
      e_00 = (ImGuiInputEvent *)in_stack_ffffffffffffff20;
      ImVector<ImGuiInputEvent>::operator[](&local_10->InputEventsQueue,local_b4);
      DebugPrintInputEvent((char *)in_stack_ffffffffffffff30,e_00);
    }
  }
  if (local_7c == (local_10->InputEventsQueue).Size) {
    ImVector<ImGuiInputEvent>::resize
              ((ImVector<ImGuiInputEvent> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  else {
    ImVector<ImGuiInputEvent>::erase
              (in_stack_ffffffffffffff40,
               (ImGuiInputEvent *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (ImGuiInputEvent *)in_stack_ffffffffffffff30);
  }
  if (((local_10->IO).AppFocusLost & 1U) != 0) {
    ImGuiIO::ClearInputKeys(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            // Trickling Rule: Stop processing queued events if we already handled a mouse button change
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                break;
            io.MousePos = event_pos;
            mouse_moved = true;
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                break;
            io.MouseDown[button] = e->MouseButton.Down;
            mouse_button_changed |= (1 << button);
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the event
            if (trickle_fast_inputs && (mouse_moved || mouse_button_changed != 0))
                break;
            io.MouseWheelH += e->MouseWheel.WheelX;
            io.MouseWheel += e->MouseWheel.WheelY;
            mouse_wheeled = true;
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            ImGuiKeyData* key_data = GetKeyData(key);
            const int key_data_index = (int)(key_data - g.IO.KeysData);
            if (trickle_fast_inputs && key_data->Down != e->Key.Down && (key_changed_mask.TestBit(key_data_index) || text_inputted || mouse_button_changed != 0))
                break;
            key_data->Down = e->Key.Down;
            key_data->AnalogValue = e->Key.AnalogValue;
            key_changed = true;
            key_changed_mask.SetBit(key_data_index);

            if (key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super)
            {
                if (key == ImGuiMod_Ctrl) { io.KeyCtrl = key_data->Down; }
                if (key == ImGuiMod_Shift) { io.KeyShift = key_data->Down; }
                if (key == ImGuiMod_Alt) { io.KeyAlt = key_data->Down; }
                if (key == ImGuiMod_Super) { io.KeySuper = key_data->Down; }
                io.KeyMods = GetMergedModsFromBools();
            }

            // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
            io.KeysDown[key_data_index] = key_data->Down;
            if (io.KeyMap[key_data_index] != -1)
                io.KeysDown[io.KeyMap[key_data_index]] = key_data->Down;
#endif
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process in NewFrame(), in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            const bool focus_lost = !e->AppFocused.Focused;
            io.AppFocusLost = focus_lost;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG_IO("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (event_n != 0 && (g.DebugLogFlags & ImGuiDebugLogFlags_EventIO))
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugPrintInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);
#endif

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // - this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle.
    // - we clear in EndFrame() and not now in order allow application/user code polling this flag
    //   (e.g. custom backend may want to clear additional data, custom widgets may want to react with a "canceling" event).
    if (g.IO.AppFocusLost)
        g.IO.ClearInputKeys();
}